

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void rmsub_stride(double *A,double *B,double *C,int rows,int cols,int p,int sA,int sB,int sC)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = cols + rows + p;
  while (0xc0 < iVar1) {
    rows = rows / 2;
    cols = cols / 2;
    p = p / 2;
    rmsub_stride(A,B,C,rows,cols,p,sA,sB,sC);
    rmsub_stride(A + cols,B + cols,C + cols,rows,cols,p,sA,sB,sC);
    rmsub_stride(A + rows * sB,B + rows * sC,C + rows * sC,rows,cols,p,sA,sB,sC);
    A = A + rows * sB + cols;
    B = B + rows * sC + cols;
    C = C + rows * sC + cols;
    iVar1 = cols + rows + p;
  }
  if (0 < rows) {
    uVar2 = 0;
    do {
      if (0 < cols) {
        uVar3 = 0;
        do {
          C[uVar3] = A[uVar3] - B[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)cols != uVar3);
      }
      uVar2 = uVar2 + 1;
      C = C + sC;
      B = B + sB;
      A = A + sA;
    } while (uVar2 != (uint)rows);
  }
  return;
}

Assistant:

void rmsub_stride(double* A, double* B, double* C,int rows,int cols,int p,int sA,int sB,int sC) {
	int i,j,u,v,w;
	if (rows + cols + p <= CUTOFF) {
		for (i = 0; i < rows; ++i) {
			u = i * sC;
			v = i * sA;
			w = i * sB;
			for(j = 0; j < cols;j++) {
				C[j + u] = A[j + v] - B[j + w];
			}
		}
		
	 } else {
		 rows/=2;cols/=2;p/=2;
		 rmsub_stride(A,B,C,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + cols,B + cols,C + cols,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + rows *sB,B + rows *sC,C + rows *sC,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + rows *sB + cols,B + rows *sC + cols,C + rows *sC + cols,rows,cols,p,sA,sB,sC);
	 }
}